

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O3

Constraint * __thiscall
slang::ast::ConstraintBlockSymbol::getConstraints(ConstraintBlockSymbol *this)

{
  short sVar1;
  Scope *pSVar2;
  SyntaxNode *pSVar3;
  Symbol *pSVar4;
  Scope *scope;
  size_t sVar5;
  undefined1 auVar6 [16];
  DiagCode DVar7;
  int iVar8;
  Diagnostic *pDVar9;
  undefined4 extraout_var;
  SourceLocation SVar10;
  Diagnostic *this_00;
  InvalidConstraint *pIVar11;
  socklen_t __len;
  socklen_t extraout_EDX;
  undefined8 extraout_RDX;
  long extraout_RDX_00;
  long lVar12;
  long extraout_RDX_01;
  DiagCode code;
  byte bVar13;
  byte bVar14;
  bool bVar15;
  SourceRange sourceRange;
  ASTContext context;
  Token local_88;
  tuple<const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*> local_78;
  Scope *local_60;
  char local_58 [8];
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  
  if (this->constraint != (Constraint *)0x0) {
    return this->constraint;
  }
  pSVar2 = (this->super_Symbol).parentScope;
  pSVar3 = (this->super_Symbol).originatingSyntax;
  local_60 = &this->super_Scope;
  __len = 0xffffffff;
  local_58[0] = -1;
  local_58[1] = -1;
  local_58[2] = -1;
  local_58[3] = -1;
  local_50 = 0;
  uStack_48 = 0;
  local_40 = 0;
  uStack_38 = 0;
  local_30 = 0;
  if (pSVar3->kind == ConstraintPrototype) {
    pSVar4 = pSVar2->thisSym;
    scope = pSVar4->parentScope;
    Compilation::findOutOfBlockDecl
              (&local_78,scope->compilation,scope,pSVar4->name,(this->super_Symbol).name);
    sVar5 = (this->super_Symbol).name._M_len;
    if ((local_78.
         super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>.
         super__Head_base<0UL,_const_slang::syntax::SyntaxNode_*,_false>._M_head_impl ==
         (SyntaxNode *)0x0) ||
       (bVar15 = (local_78.
                  super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
                  .super__Head_base<0UL,_const_slang::syntax::SyntaxNode_*,_false>._M_head_impl)->
                 kind != ConstraintDeclaration,
       lVar12 = CONCAT71((int7)((ulong)extraout_RDX >> 8),sVar5 == 0 || bVar15),
       sVar5 == 0 || bVar15)) {
      bVar13 = (this->flags).m_bits;
      if (sVar5 != 0 && (bVar13 & 2) == 0) {
        DVar7.subsystem = Declarations;
        DVar7.code = 0xf5;
        code.subsystem = Declarations;
        code.code = 0x8b;
        if ((bVar13 & 0x10) == 0) {
          code = DVar7;
        }
        pDVar9 = Scope::addDiag(scope,code,(this->super_Symbol).location);
        Diagnostic::operator<<(pDVar9,(this->super_Symbol).name);
      }
    }
    else {
      *(bool *)local_78.
               super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
               .super__Tuple_impl<1UL,_slang::ast::SymbolIndex,_bool_*>.
               super__Tuple_impl<2UL,_bool_*>.super__Head_base<2UL,_bool_*,_false>._M_head_impl =
           true;
      if (((this->flags).m_bits & 2) == 0) {
        this->outOfBlockIndex =
             local_78.
             super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
             .super__Tuple_impl<1UL,_slang::ast::SymbolIndex,_bool_*>.
             super__Head_base<1UL,_slang::ast::SymbolIndex,_false>._M_head_impl;
        if (local_78.
            super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
            .super__Tuple_impl<1UL,_slang::ast::SymbolIndex,_bool_*>.
            super__Head_base<1UL,_slang::ast::SymbolIndex,_false>._M_head_impl <=
            pSVar4->indexInScope) {
          local_88 = slang::syntax::SyntaxNode::getLastToken
                               (local_78.
                                super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
                                .super__Head_base<0UL,_const_slang::syntax::SyntaxNode_*,_false>.
                                _M_head_impl[8].previewNode);
          SVar10 = parsing::Token::location(&local_88);
          pDVar9 = Scope::addDiag(scope,(DiagCode)0x6e0006,SVar10);
          this_00 = Diagnostic::operator<<(pDVar9,(this->super_Symbol).name);
          Diagnostic::operator<<(this_00,pSVar4->name);
          Diagnostic::addNote(pDVar9,(DiagCode)0x50001,pSVar4->location);
          lVar12 = extraout_RDX_00;
        }
        if (local_78.
            super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
            .super__Head_base<0UL,_const_slang::syntax::SyntaxNode_*,_false>._M_head_impl[5].parent
            != (SyntaxNode *)0x0) {
          lVar12 = 0;
          do {
            if (*(short *)(*(long *)(local_78.
                                     super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
                                     .
                                     super__Head_base<0UL,_const_slang::syntax::SyntaxNode_*,_false>
                                     ._M_head_impl + 5) + lVar12) == 0x11c) {
              if (((this->flags).m_bits & 4) != 0) goto LAB_003a9caa;
              goto LAB_003a9c70;
            }
            lVar12 = lVar12 + 0x10;
          } while ((long)local_78.
                         super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
                         .super__Head_base<0UL,_const_slang::syntax::SyntaxNode_*,_false>.
                         _M_head_impl[5].parent << 4 != lVar12);
        }
        if (((this->flags).m_bits & 4) != 0) {
LAB_003a9c70:
          local_88 = slang::syntax::SyntaxNode::getFirstToken
                               (local_78.
                                super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
                                .super__Head_base<0UL,_const_slang::syntax::SyntaxNode_*,_false>.
                                _M_head_impl);
          SVar10 = parsing::Token::location(&local_88);
          pDVar9 = Scope::addDiag(scope,(DiagCode)0x790006,SVar10);
          Diagnostic::addNote(pDVar9,(DiagCode)0x50001,(this->super_Symbol).location);
          lVar12 = extraout_RDX_01;
        }
LAB_003a9caa:
        if (local_78.
            super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
            .super__Head_base<0UL,_const_slang::syntax::SyntaxNode_*,_false>._M_head_impl[8].parent
            == (SyntaxNode *)0x0) {
          bVar13 = 0;
        }
        else {
          lVar12 = 0;
          bVar13 = 0;
          bVar14 = 0;
          do {
            if ((*(byte *)(*(long *)(*(long *)(local_78.
                                               super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
                                               .
                                               super__Head_base<0UL,_const_slang::syntax::SyntaxNode_*,_false>
                                               ._M_head_impl + 8) + lVar12) + 0x2a) & 1) == 0) {
              sVar1 = *(short *)(*(long *)(*(long *)(local_78.
                                                  super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
                                                  .
                                                  super__Head_base<0UL,_const_slang::syntax::SyntaxNode_*,_false>
                                                  ._M_head_impl + 8) + lVar12) + 0x28);
              if (sVar1 == 0xc0) {
                bVar13 = 0x20;
              }
              else if (sVar1 == 0xa8) {
                bVar13 = 0x80;
              }
              else {
                bVar13 = 0x40;
              }
              bVar14 = bVar13 | bVar14;
              bVar13 = bVar14;
            }
            lVar12 = lVar12 + 8;
          } while ((long)local_78.
                         super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
                         .super__Head_base<0UL,_const_slang::syntax::SyntaxNode_*,_false>.
                         _M_head_impl[8].parent << 3 != lVar12);
        }
        __len = (socklen_t)lVar12;
        if (bVar13 != ((this->flags).m_bits & 0xe0)) {
          local_88 = slang::syntax::SyntaxNode::getLastToken
                               (local_78.
                                super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
                                .super__Head_base<0UL,_const_slang::syntax::SyntaxNode_*,_false>.
                                _M_head_impl[8].previewNode);
          SVar10 = parsing::Token::location(&local_88);
          pDVar9 = Scope::addDiag(scope,(DiagCode)0x780006,SVar10);
          Diagnostic::addNote(pDVar9,(DiagCode)0x50001,(this->super_Symbol).location);
          __len = extraout_EDX;
        }
        iVar8 = (int)*(undefined8 *)
                      (local_78.
                       super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
                       .super__Head_base<0UL,_const_slang::syntax::SyntaxNode_*,_false>._M_head_impl
                      + 9);
        goto LAB_003a9ba7;
      }
      sourceRange = slang::syntax::SyntaxNode::sourceRange
                              (local_78.
                               super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
                               .super__Head_base<0UL,_const_slang::syntax::SyntaxNode_*,_false>.
                               _M_head_impl[8].previewNode);
      pDVar9 = Scope::addDiag(scope,(DiagCode)0xd0006,sourceRange);
      Diagnostic::addNote(pDVar9,(DiagCode)0x50001,(this->super_Symbol).location);
    }
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_88.info;
    local_88 = (Token)(auVar6 << 0x40);
    pIVar11 = BumpAllocator::emplace<slang::ast::InvalidConstraint,decltype(nullptr)>
                        (&pSVar2->compilation->super_BumpAllocator,(void **)&local_88);
  }
  else {
    iVar8 = (int)*(undefined8 *)(pSVar3 + 9);
LAB_003a9ba7:
    iVar8 = Constraint::bind(iVar8,(sockaddr *)&local_60,__len);
    pIVar11 = (InvalidConstraint *)CONCAT44(extraout_var,iVar8);
  }
  this->constraint = &pIVar11->super_Constraint;
  return &pIVar11->super_Constraint;
}

Assistant:

const Constraint& ConstraintBlockSymbol::getConstraints() const {
    if (constraint)
        return *constraint;

    auto syntax = getSyntax();
    auto scope = getParentScope();
    SLANG_ASSERT(syntax && scope);
    ASTContext context(*this, LookupLocation::max);

    if (syntax->kind == SyntaxKind::ConstraintPrototype) {
        // The out-of-block definition must be in our parent scope.
        auto& parentSym = scope->asSymbol();
        auto& outerScope = *parentSym.getParentScope();
        auto& comp = outerScope.getCompilation();

        auto [declSyntax, index, used] = comp.findOutOfBlockDecl(outerScope, parentSym.name, name);
        if (!declSyntax || declSyntax->kind != SyntaxKind::ConstraintDeclaration || name.empty()) {
            if (!flags.has(ConstraintBlockFlags::Pure) && !name.empty()) {
                DiagCode code = flags.has(ConstraintBlockFlags::ExplicitExtern)
                                    ? diag::NoMemberImplFound
                                    : diag::NoConstraintBody;
                outerScope.addDiag(code, location) << name;
            }
            constraint = scope->getCompilation().emplace<InvalidConstraint>(nullptr);
            return *constraint;
        }

        auto& cds = declSyntax->as<ConstraintDeclarationSyntax>();
        *used = true;

        if (flags.has(ConstraintBlockFlags::Pure)) {
            auto& diag = outerScope.addDiag(diag::BodyForPureConstraint, cds.name->sourceRange());
            diag.addNote(diag::NoteDeclarationHere, location);
            constraint = scope->getCompilation().emplace<InvalidConstraint>(nullptr);
            return *constraint;
        }

        // The method definition must be located after the class definition.
        outOfBlockIndex = index;
        if (index <= parentSym.getIndex()) {
            auto& diag = outerScope.addDiag(diag::MemberDefinitionBeforeClass,
                                            cds.name->getLastToken().location());
            diag << name << parentSym.name;
            diag.addNote(diag::NoteDeclarationHere, parentSym.location);
        }

        bool declStatic = false;
        for (auto qual : cds.qualifiers) {
            if (qual.kind == TokenKind::StaticKeyword) {
                declStatic = true;
                break;
            }
        }

        if (declStatic != flags.has(ConstraintBlockFlags::Static)) {
            auto& diag = outerScope.addDiag(diag::MismatchStaticConstraint,
                                            cds.getFirstToken().location());
            diag.addNote(diag::NoteDeclarationHere, location);
        }

        bitmask<ConstraintBlockFlags> declFlags;
        addSpecifierFlags(cds.specifiers, declFlags);

        if (declFlags != (flags & (ConstraintBlockFlags::Initial | ConstraintBlockFlags::Extends |
                                   ConstraintBlockFlags::Final))) {
            auto& diag = outerScope.addDiag(diag::MismatchConstraintSpecifiers,
                                            cds.name->getLastToken().location());
            diag.addNote(diag::NoteDeclarationHere, location);
        }

        constraint = &Constraint::bind(*cds.block, context);
        return *constraint;
    }

    constraint = &Constraint::bind(*syntax->as<ConstraintDeclarationSyntax>().block, context);
    return *constraint;
}